

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void move_player(wchar_t dir,_Bool disarm)

{
  short sVar1;
  loc_conflict grid_00;
  loc_conflict grid1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t wVar5;
  loc_conflict grid_01;
  square_conflict *psVar6;
  monster_conflict *mon_00;
  feature *pfVar7;
  command *pcVar8;
  wchar_t dam_taken;
  feature *feat;
  _Bool step;
  _Bool new_dtrap;
  _Bool old_dtrap;
  _Bool door;
  _Bool trap;
  _Bool trapsafe;
  monster *mon;
  wchar_t m_idx;
  loc_conflict grid;
  _Bool disarm_local;
  wchar_t dir_local;
  
  grid_01 = (loc_conflict)loc_sum(player->grid,ddgrid[dir]);
  psVar6 = square((chunk *)cave,grid_01);
  sVar1 = psVar6->mon;
  mon_00 = cave_monster(cave,(int)sVar1);
  _Var2 = player_is_trapsafe(player);
  _Var3 = square_isdisarmabletrap((chunk *)cave,grid_01);
  _Var4 = square_iscloseddoor((chunk *)cave,grid_01);
  if (sVar1 < L'\x01') {
    if ((((_Var3) && (disarm)) || (_Var4)) && (_Var4 = square_isknown((chunk *)cave,grid_01), _Var4)
       ) {
      wVar5 = cmd_get_nrepeats();
      if (wVar5 == L'\0') {
        cmd_set_repeat(L'c');
      }
      do_cmd_alter_aux(dir);
    }
    else if (((!_Var3) || (player->upkeep->running == L'\0')) || (_Var2)) {
      _Var2 = square_ispassable((chunk *)cave,grid_01);
      if (_Var2) {
        grid_00.x = (player->grid).x;
        grid_00.y = (player->grid).y;
        _Var2 = square_isdtrap((chunk *)cave,grid_00);
        _Var3 = square_isdtrap((chunk *)cave,grid_01);
        feat._2_1_ = true;
        if (_Var2 != _Var3) {
          player->upkeep->redraw = player->upkeep->redraw | 0x4000;
        }
        if (((player->upkeep->running != L'\0') && ((player->upkeep->running_firststep & 1U) == 0))
           && ((_Var2 && (!_Var3)))) {
          disturb(player);
          player->upkeep->energy_use = L'\0';
          return;
        }
        _Var2 = square_isdamaging((chunk *)cave,grid_01);
        if (((_Var2) || (_Var2 = square_isfall((chunk *)cave,grid_01), _Var2)) &&
           (player->timed[4] == 0)) {
          pfVar7 = square_feat((chunk *)cave,grid_01);
          wVar5 = player_check_terrain_damage(player,(loc)grid_01,false);
          if ((player->upkeep->running == L'\0') || (wVar5 == L'\0')) {
            if (((int)player->chp / 3 < wVar5) ||
               (_Var2 = square_isfall((chunk *)cave,grid_01), _Var2)) {
              feat._2_1_ = get_check(pfVar7->walk_msg);
            }
          }
          else {
            _Var2 = get_check(pfVar7->run_msg);
            if (!_Var2) {
              player->upkeep->running = L'\0';
            }
            feat._2_1_ = _Var2;
          }
        }
        if (feat._2_1_ == false) {
          player->upkeep->energy_use = L'\0';
        }
        else {
          grid1.x = (player->grid).x;
          grid1.y = (player->grid).y;
          monster_swap(grid1,grid_01);
          player_handle_post_move(player,true,false);
          cmdq_push(CMD_AUTOPICKUP);
          pcVar8 = cmdq_peek();
          pcVar8->background_command = 2;
        }
      }
      else {
        disturb(player);
        _Var2 = square_isknown((chunk *)cave,grid_01);
        if (_Var2) {
          _Var2 = square_isrubble((chunk *)cave,grid_01);
          if (_Var2) {
            msgt(0x10,"There is a pile of rubble blocking your way.");
            _Var2 = square_isrubble((chunk *)player->cave,grid_01);
            if (!_Var2) {
              square_memorize((chunk *)cave,grid_01);
              square_light_spot((chunk *)cave,(loc)grid_01);
            }
          }
          else {
            _Var2 = square_iscloseddoor((chunk *)cave,grid_01);
            if (_Var2) {
              msgt(0x10,"There is a door blocking your way.");
              _Var2 = square_iscloseddoor((chunk *)player->cave,grid_01);
              if (!_Var2) {
                square_memorize((chunk *)cave,grid_01);
                square_light_spot((chunk *)cave,(loc)grid_01);
              }
            }
            else {
              msgt(0x10,"There is a wall blocking your way.");
              _Var2 = square_ispassable((chunk *)player->cave,grid_01);
              if (((_Var2) || (_Var2 = square_isrubble((chunk *)player->cave,grid_01), _Var2)) ||
                 (_Var2 = square_iscloseddoor((chunk *)player->cave,grid_01), _Var2)) {
                square_forget((chunk *)cave,grid_01);
                square_light_spot((chunk *)cave,(loc)grid_01);
              }
            }
          }
        }
        else {
          _Var2 = square_isrubble((chunk *)cave,grid_01);
          if (_Var2) {
            msgt(0x10,"You feel a pile of rubble blocking your way.");
            square_memorize((chunk *)cave,grid_01);
            square_light_spot((chunk *)cave,(loc)grid_01);
          }
          else {
            _Var2 = square_iscloseddoor((chunk *)cave,grid_01);
            if (_Var2) {
              msgt(0x10,"You feel a door blocking your way.");
              square_memorize((chunk *)cave,grid_01);
              square_light_spot((chunk *)cave,(loc)grid_01);
            }
            else {
              msgt(0x10,"You feel a wall blocking your way.");
              square_memorize((chunk *)cave,grid_01);
              square_light_spot((chunk *)cave,(loc)grid_01);
            }
          }
        }
      }
    }
    else {
      disturb(player);
      player->upkeep->energy_use = L'\0';
    }
  }
  else {
    _Var2 = monster_is_camouflaged((monster *)mon_00);
    if (_Var2) {
      become_aware((chunk *)cave,(monster *)mon_00);
      monster_wake((monster *)mon_00,false,L'd');
    }
    else {
      py_attack(player,grid_01);
    }
  }
  player->upkeep->running_firststep = false;
  return;
}

Assistant:

void move_player(int dir, bool disarm)
{
	struct loc grid = loc_sum(player->grid, ddgrid[dir]);

	int m_idx = square(cave, grid)->mon;
	struct monster *mon = cave_monster(cave, m_idx);
	bool trapsafe = player_is_trapsafe(player);
	bool trap = square_isdisarmabletrap(cave, grid);
	bool door = square_iscloseddoor(cave, grid);

	/* Many things can happen on movement */
	if (m_idx > 0) {
		/* Attack monsters */
		if (monster_is_camouflaged(mon)) {
			become_aware(cave, mon);

			/* Camouflaged monster wakes up and becomes aware */
			monster_wake(mon, false, 100);
		} else {
			py_attack(player, grid);
		}
	} else if (((trap && disarm) || door) && square_isknown(cave, grid)) {
		/* Auto-repeat if not already repeating */
		if (cmd_get_nrepeats() == 0)
			cmd_set_repeat(99);
		do_cmd_alter_aux(dir);
	} else if (trap && player->upkeep->running && !trapsafe) {
		/* Stop running before known traps */
		disturb(player);
		/* No move made so no energy spent. */
		player->upkeep->energy_use = 0;
	} else if (!square_ispassable(cave, grid)) {
		disturb(player);

		/* Notice unknown obstacles, mention known obstacles */
		if (!square_isknown(cave, grid)) {
			if (square_isrubble(cave, grid)) {
				msgt(MSG_HITWALL,
					 "You feel a pile of rubble blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			} else if (square_iscloseddoor(cave, grid)) {
				msgt(MSG_HITWALL, "You feel a door blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			} else {
				msgt(MSG_HITWALL, "You feel a wall blocking your way.");
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			}
		} else {
			if (square_isrubble(cave, grid)) {
				msgt(MSG_HITWALL,
					 "There is a pile of rubble blocking your way.");
				if (!square_isrubble(player->cave, grid)) {
					square_memorize(cave, grid);
					square_light_spot(cave, grid);
				}
			} else if (square_iscloseddoor(cave, grid)) {
				msgt(MSG_HITWALL, "There is a door blocking your way.");
				if (!square_iscloseddoor(player->cave, grid)) {
					square_memorize(cave, grid);
					square_light_spot(cave, grid);
				}
			} else {
				msgt(MSG_HITWALL, "There is a wall blocking your way.");
				if (square_ispassable(player->cave, grid)
						|| square_isrubble(player->cave, grid)
						|| square_iscloseddoor(player->cave, grid)) {
					square_forget(cave, grid);
					square_light_spot(cave, grid);
				}
			}
		}
		/*
		 * No move but do not refund energy:  primarily so that
		 * confused moves while blind or without light take energy.
		 */
	} else {
		/* See if trap detection status will change */
		bool old_dtrap = square_isdtrap(cave, player->grid);
		bool new_dtrap = square_isdtrap(cave, grid);
		bool step = true;

		/* Note the change in the detect status */
		if (old_dtrap != new_dtrap)
			player->upkeep->redraw |= (PR_DTRAP);

		/* Disturb player if the player is about to leave the area */
		if (player->upkeep->running
				&& !player->upkeep->running_firststep
				&& old_dtrap && !new_dtrap) {
			disturb(player);
			/* No move made so no energy spent. */
			player->upkeep->energy_use = 0;
			return;
		}

		/*
		 * If not confused, allow check before moving into damaging
		 * terrain.
		 */
		if ((square_isdamaging(cave, grid) || square_isfall(cave, grid))
			&& !player->timed[TMD_CONFUSED]) {
			struct feature *feat = square_feat(cave, grid);
			int dam_taken = player_check_terrain_damage(player,
				grid, false);

			/*
			 * Check if running, or going to cost more than a
			 * third of hp.
			 */
			if (player->upkeep->running && dam_taken) {
				if (!get_check(feat->run_msg)) {
					player->upkeep->running = 0;
					step = false;
				}
			} else {
				if ((dam_taken > player->chp / 3) || square_isfall(cave, grid)){
					step = get_check(feat->walk_msg);
				}
			}
		}

		if (step) {
			/* Move player */
			monster_swap(player->grid, grid);
			player_handle_post_move(player, true, false);
			cmdq_push(CMD_AUTOPICKUP);
			/*
			 * The autopickup is a side effect of the move:
			 * whatever command triggered the move will be the
			 * target for CMD_REPEAT rather than repeating the
			 * autopickup, and the autopickup won't trigger
			 * bloodlust.
			 */
			cmdq_peek()->background_command = 2;
		} else {
			/* No move made so no energy spent. */
			player->upkeep->energy_use = 0;
		}
	}

	player->upkeep->running_firststep = false;
}